

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

re_status_t __thiscall
CRegexParser::compile
          (CRegexParser *this,char *expr_str,size_t exprlen,re_compiled_pattern_base *pat)

{
  long lVar1;
  size_t sVar2;
  re_state_id rVar3;
  byte bVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  re_machine rVar15;
  re_recog_type typ;
  uint uVar16;
  re_machine rVar17;
  CRegexParser *pCVar18;
  utf8_ptr uVar19;
  utf8_ptr uVar20;
  ulong uVar21;
  re_machine *machine;
  utf8_ptr this_00;
  ulong uVar22;
  CRegexParser *pCVar23;
  ulong uVar24;
  byte *pbVar25;
  re_machine new_machine;
  re_machine cur_machine;
  re_machine new_machine_1;
  re_machine alter_machine;
  anon_struct_36_7_ed371931 group_stack [20];
  utf8_ptr local_368;
  CRegexParser *local_360;
  byte *local_358;
  re_machine local_350;
  re_machine local_348;
  re_machine local_340;
  int local_334;
  re_machine local_330;
  re_compiled_pattern_base *local_328;
  ulong local_320;
  re_machine local_318;
  int local_310;
  int local_30c;
  re_machine arStack_308 [2];
  int iStack_2f8;
  undefined8 uStack_2f4;
  uint auStack_2ec [175];
  
  local_360 = this;
  reset(this);
  pat->group_cnt = 0;
  pat->loop_var_cnt = 0;
  local_320 = 0;
  if ((long)exprlen < 1) {
    pbVar25 = (byte *)0x0;
  }
  else {
    pbVar25 = (byte *)0x0;
    pbVar11 = (byte *)expr_str;
    do {
      pbVar11 = pbVar11 + (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3) + 1;
      pbVar25 = pbVar25 + 1;
    } while (pbVar11 < expr_str + exprlen);
  }
  pat->field_0x14 = pat->field_0x14 & 0xf0 | 0xd;
  local_340.init = -1;
  local_340.final = -1;
  local_318.init = -1;
  local_318.final = -1;
  rVar17.init = -1;
  rVar17.final = 0;
  local_334 = -1;
  uVar21 = 0xffffffff;
  iVar9 = -1;
  iVar10 = -1;
  uVar22 = 0xffffffff;
  uVar24 = 0xffffffff;
  rVar15.init = -1;
  rVar15.final = 0;
  local_368.p_ = expr_str;
  local_328 = pat;
LAB_002ad85e:
  uVar19.p_ = local_368.p_;
  local_358 = pbVar25;
  if (pbVar25 == (byte *)0x0) goto LAB_002ae413;
  local_348 = rVar17;
  local_310 = iVar10;
  local_30c = iVar9;
  wVar5 = utf8_ptr::s_getch(local_368.p_);
  pCVar23 = local_360;
  if (L';' < wVar5) {
    if (wVar5 < L'^') {
      if (wVar5 == L'<') {
        if ((byte *)0x3 < pbVar25) {
          iVar10 = memicmp(uVar19.p_,"<FE>",4);
          if ((iVar10 == 0) ||
             (((byte *)0x9 < pbVar25 && (iVar10 = memicmp(uVar19.p_,"<FirstEnd>",10), iVar10 == 0)))
             ) {
            bVar4 = local_328->field_0x14 & 0xf7;
            goto LAB_002adf16;
          }
          iVar10 = memicmp(uVar19.p_,"<FB>",4);
          if (iVar10 == 0) {
LAB_002ade51:
            bVar4 = local_328->field_0x14 | 8;
LAB_002adf16:
            local_328->field_0x14 = bVar4;
            do {
              wVar5 = utf8_ptr::s_getch(uVar19.p_);
              rVar17 = local_348;
              iVar10 = local_310;
              iVar9 = local_30c;
              pbVar11 = pbVar25;
              if (wVar5 == L'>') goto LAB_002ae8a9;
              bVar4 = (byte)((CRegexParser *)uVar19.p_)->next_state_;
              uVar19.p_ = (char *)((long)&((CRegexParser *)uVar19.p_)->next_state_ +
                                  (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1)
              ;
              pbVar25 = pbVar25 + -1;
            } while (pbVar25 != (byte *)0x0);
            pbVar25 = (byte *)0x0;
            pbVar11 = pbVar25;
            goto LAB_002ae8a9;
          }
          if (pbVar25 < (byte *)0xc) {
            if (pbVar25 == (byte *)0x4) goto LAB_002ae0ab;
          }
          else {
            iVar10 = memicmp(uVar19.p_,"<FirstBegin>",0xc);
            if (iVar10 == 0) goto LAB_002ade51;
          }
          iVar10 = memicmp(uVar19.p_,"<Max>",5);
          if (iVar10 == 0) {
            bVar4 = local_328->field_0x14 | 4;
            goto LAB_002adf16;
          }
          iVar10 = memicmp(uVar19.p_,"<Min>",5);
          if (iVar10 == 0) {
            bVar4 = local_328->field_0x14 & 0xfb;
            goto LAB_002adf16;
          }
          if ((byte *)0x5 < pbVar25) {
            iVar10 = memicmp(uVar19.p_,"<Case>",6);
            if (iVar10 == 0) {
              bVar4 = local_328->field_0x14 | 3;
              goto LAB_002adf16;
            }
            if (((byte *)0x7 < pbVar25) && (iVar10 = memicmp(uVar19.p_,"<NoCase>",8), iVar10 == 0))
            {
              bVar4 = local_328->field_0x14 & 0xfc | 2;
              goto LAB_002adf16;
            }
          }
        }
LAB_002ae0ab:
        pCVar23 = local_360;
        iVar10 = compile_char_class_expr(local_360,&local_368,(size_t *)&local_358,&local_350);
        rVar15 = local_348;
        uVar19.p_ = local_368.p_;
        pbVar25 = local_358;
        if (iVar10 != 0) goto LAB_002ae502;
        goto LAB_002ade8c;
      }
      if (wVar5 != L'[') goto switchD_002ad89f_caseD_26;
      local_360->range_buf_cnt_ = 0;
      iVar10 = 0;
      pCVar18 = (CRegexParser *)
                (uVar19.p_ +
                (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*uVar19.p_ >> 7) * 3)
                + 1);
      pbVar11 = pbVar25 + -1;
      if (pbVar11 != (byte *)0x0) {
        local_368.p_ = (char *)pCVar18;
        local_358 = pbVar11;
        wVar5 = utf8_ptr::s_getch((char *)pCVar18);
        iVar10 = 0;
        if (wVar5 == L'^') {
          bVar4 = (byte)pCVar18->next_state_;
          pCVar18 = (CRegexParser *)
                    ((long)&pCVar18->next_state_ +
                    (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
          iVar10 = 1;
          pbVar11 = pbVar25 + -2;
          local_368.p_ = (char *)pCVar18;
          local_358 = pbVar11;
          if (pbVar11 == (byte *)0x0) goto LAB_002adb92;
        }
        wVar5 = utf8_ptr::s_getch((char *)pCVar18);
        if (wVar5 == L']') {
          ensure_range_buf_space(pCVar23);
          sVar2 = pCVar23->range_buf_cnt_;
          pCVar23->range_buf_cnt_ = sVar2 + 1;
          pCVar23->range_buf_[sVar2] = L']';
          sVar2 = pCVar23->range_buf_cnt_;
          pCVar23->range_buf_cnt_ = sVar2 + 1;
          pCVar23->range_buf_[sVar2] = L']';
          bVar4 = (byte)pCVar18->next_state_;
          pCVar18 = (CRegexParser *)
                    ((long)&pCVar18->next_state_ +
                    (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
          pbVar11 = pbVar11 + -1;
          local_368.p_ = (char *)pCVar18;
          local_358 = pbVar11;
          if (pbVar11 == (byte *)0x0) goto LAB_002adb92;
        }
        wVar5 = utf8_ptr::s_getch((char *)pCVar18);
        if (wVar5 == L'-') {
          ensure_range_buf_space(pCVar23);
          sVar2 = pCVar23->range_buf_cnt_;
          pCVar23->range_buf_cnt_ = sVar2 + 1;
          pCVar23->range_buf_[sVar2] = L'-';
          sVar2 = pCVar23->range_buf_cnt_;
          pCVar23->range_buf_cnt_ = sVar2 + 1;
          pCVar23->range_buf_[sVar2] = L'-';
          bVar4 = (byte)pCVar18->next_state_;
          pCVar18 = (CRegexParser *)
                    ((long)&pCVar18->next_state_ +
                    (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
          pbVar11 = pbVar11 + -1;
          local_368.p_ = (char *)pCVar18;
          local_358 = pbVar11;
          if (pbVar11 == (byte *)0x0) goto LAB_002adb92;
        }
        do {
          wVar5 = utf8_ptr::s_getch((char *)pCVar18);
          if (wVar5 == L']') goto LAB_002adb95;
          wVar5 = utf8_ptr::s_getch((char *)pCVar18);
          bVar4 = (byte)pCVar18->next_state_;
          pCVar18 = (CRegexParser *)
                    ((long)&pCVar18->next_state_ +
                    (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
          pbVar25 = pbVar11 + -1;
          if ((pbVar25 == (byte *)0x0) ||
             (wVar6 = utf8_ptr::s_getch((char *)pCVar18), wVar6 != L'-')) {
            add_range_char(local_360,wVar5,wVar5);
          }
          else {
            bVar4 = (byte)pCVar18->next_state_;
            pCVar18 = (CRegexParser *)
                      ((long)&pCVar18->next_state_ +
                      (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
            if (pbVar11 == (byte *)0x2) {
              pbVar11 = (byte *)0x0;
              pCVar23 = local_360;
              goto LAB_002adb95;
            }
            wVar7 = utf8_ptr::s_getch((char *)pCVar18);
            bVar4 = (byte)pCVar18->next_state_;
            pCVar18 = (CRegexParser *)
                      ((long)&pCVar18->next_state_ +
                      (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
            pbVar25 = pbVar11 + -3;
            wVar6 = wVar7;
            if (wVar5 < wVar7) {
              wVar6 = wVar5;
            }
            if (wVar5 <= wVar7) {
              wVar5 = wVar7;
            }
            add_range_char(local_360,wVar6,wVar5);
          }
          pCVar23 = local_360;
          pbVar11 = pbVar25;
        } while (pbVar25 != (byte *)0x0);
      }
LAB_002adb92:
      pbVar11 = (byte *)0x0;
LAB_002adb95:
      local_368.p_ = (char *)pCVar18;
      local_358 = pbVar11;
      build_char_range(pCVar23,&local_350,iVar10);
      rVar15 = local_348;
      pbVar25 = pbVar11;
      goto LAB_002ae502;
    }
    if (wVar5 == L'|') {
      alternate_onto(local_360,&local_318,&local_340);
      goto LAB_002adff6;
    }
    if ((wVar5 != L'^') || ((int)uVar21 != -1)) goto LAB_002ade8c;
    build_special(local_360,&local_350,RE_TEXT_BEGIN,L'\0');
    rVar15 = local_350;
    goto LAB_002adbf2;
  }
  rVar17 = local_348;
  iVar10 = local_310;
  iVar9 = local_30c;
  switch(wVar5) {
  case L'$':
    if (((pbVar25 == (byte *)0x1) || (wVar5 = utf8_ptr::s_getch_at(uVar19.p_,1), wVar5 == L')')) ||
       (wVar5 = utf8_ptr::s_getch_at(uVar19.p_,1), wVar5 == L'|')) {
      build_special(pCVar23,&local_350,RE_TEXT_END,L'\0');
      rVar15 = local_350;
      iVar10 = local_30c;
      goto joined_r0x002ae2d3;
    }
    goto LAB_002ade8c;
  case L'%':
    uVar12 = (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*uVar19.p_ >> 7) * 3);
    pCVar18 = (CRegexParser *)(uVar19.p_ + uVar12 + 1);
    pbVar25 = pbVar25 + -1;
    if (pbVar25 == (byte *)0x0) {
      pbVar25 = (byte *)(uVar19.p_ + uVar12);
      bVar4 = pbVar25[-(ulong)(~(uint)(*pbVar25 >> 6) & (uint)(*pbVar25 >> 7))];
      local_368.p_ = (char *)(pbVar25 + -(ulong)(~(uint)(*pbVar25 >> 6) & (uint)(*pbVar25 >> 7)) +
                             -(ulong)(~(uint)(bVar4 >> 6) & (uint)(bVar4 >> 7)));
      pbVar25 = (byte *)0x0;
      goto LAB_002ae8ba;
    }
    local_368.p_ = (char *)pCVar18;
    local_358 = pbVar25;
    wVar5 = utf8_ptr::s_getch((char *)pCVar18);
    pCVar23 = local_360;
    if (L'a' < wVar5) {
      if (wVar5 < L's') {
        if (wVar5 == L'b') {
          build_special(local_360,&local_350,RE_WORD_BOUNDARY,L'\0');
          iVar10 = (int)uVar24;
          rVar15 = local_350;
          goto joined_r0x002ae2d3;
        }
        if (wVar5 != L'd') goto switchD_002add69_caseD_3a;
        typ = RE_DIGIT;
      }
      else if (wVar5 == L's') {
        typ = RE_SPACE;
      }
      else if (wVar5 == L'v') {
        typ = RE_VSPACE;
      }
      else {
        if (wVar5 != L'w') goto switchD_002add69_caseD_3a;
        typ = RE_WORD_CHAR;
      }
      goto LAB_002adda0;
    }
    break;
  default:
switchD_002ad89f_caseD_26:
LAB_002ade8c:
    wVar5 = utf8_ptr::s_getch(uVar19.p_);
LAB_002ade94:
    build_char(pCVar23,&local_350,wVar5);
    rVar15 = local_348;
    pbVar25 = local_358;
    goto LAB_002ae502;
  case L'(':
    if (0x14 < (int)local_320) {
      return RE_STATUS_GROUP_NESTING_TOO_DEEP;
    }
    lVar13 = (long)(int)local_320;
    lVar1 = lVar13 * 0x24;
    *(re_machine *)((long)arStack_308 + lVar1) = local_340;
    *(re_machine *)((long)arStack_308 + lVar1 + 8) = local_318;
    (&iStack_2f8)[lVar13 * 9] = local_328->group_cnt;
    if ((pbVar25 < (byte *)0x3) || (wVar5 = utf8_ptr::s_getch_at(uVar19.p_,1), wVar5 != L'?')) {
LAB_002adfc9:
      *(undefined8 *)((long)&uStack_2f4 + lVar1) = 1;
      (auStack_2ec + lVar13 * 9)[0] = 0;
      (auStack_2ec + lVar13 * 9)[1] = 0;
      local_328->group_cnt = local_328->group_cnt + 1;
    }
    else {
      wVar5 = utf8_ptr::s_getch_at(uVar19.p_,2);
      if (wVar5 < L'<') {
        if (wVar5 == L'!') {
          uVar14 = 0;
          uVar21 = (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 &
                          (uint)((byte)*uVar19.p_ >> 7) * 3);
          local_368.p_ = uVar19.p_ +
                         ((((byte)uVar19.p_[uVar21 + 1] >> 5 & 1) != 0) + 1 &
                         (uint)((byte)uVar19.p_[uVar21 + 1] >> 7) * 3) + uVar21 + 2;
          uVar16 = 1;
        }
        else {
          if (wVar5 != L':') goto LAB_002adfc9;
          uVar14 = 0;
          uVar21 = (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 &
                          (uint)((byte)*uVar19.p_ >> 7) * 3);
          local_368.p_ = uVar19.p_ +
                         ((((byte)uVar19.p_[uVar21 + 1] >> 5 & 1) != 0) + 1 &
                         (uint)((byte)uVar19.p_[uVar21 + 1] >> 7) * 3) + uVar21 + 2;
          uVar16 = 0;
        }
LAB_002ae1bf:
        pbVar25 = pbVar25 + -2;
        uVar8 = 0;
      }
      else {
        if (wVar5 == L'=') {
          uVar16 = 0;
          uVar21 = (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 &
                          (uint)((byte)*uVar19.p_ >> 7) * 3);
          local_368.p_ = uVar19.p_ +
                         ((((byte)uVar19.p_[uVar21 + 1] >> 5 & 1) != 0) + 1 &
                         (uint)((byte)uVar19.p_[uVar21 + 1] >> 7) * 3) + uVar21 + 2;
          uVar14 = 1;
          goto LAB_002ae1bf;
        }
        if (((wVar5 != L'<') || (pbVar25 == (byte *)0x3)) ||
           ((wVar5 = utf8_ptr::s_getch_at(uVar19.p_,3), wVar5 != L'=' &&
            (wVar5 = utf8_ptr::s_getch_at(uVar19.p_,3), wVar5 != L'!')))) goto LAB_002adfc9;
        wVar5 = utf8_ptr::s_getch_at(uVar19.p_,3);
        uVar16 = (uint)(wVar5 != L'=');
        uVar14 = (uint)(wVar5 == L'=');
        uVar21 = (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*uVar19.p_ >> 7) * 3)
        ;
        uVar22 = (ulong)((((byte)uVar19.p_[uVar21 + 1] >> 5 & 1) != 0) + 1 &
                        (uint)((byte)uVar19.p_[uVar21 + 1] >> 7) * 3);
        local_368.p_ = uVar19.p_ +
                       (ulong)((((byte)uVar19.p_[uVar22 + 2 + uVar21] >> 5 & 1) != 0) + 1 &
                              (uint)((byte)uVar19.p_[uVar22 + 2 + uVar21] >> 7) * 3) +
                       uVar22 + uVar21 + 3;
        pbVar25 = pbVar25 + -3;
        uVar8 = 1;
      }
      *(undefined4 *)((long)&uStack_2f4 + lVar1) = 0;
      auStack_2ec[lVar13 * 9] = uVar14;
      auStack_2ec[lVar13 * 9 + -1] = uVar16;
      auStack_2ec[lVar13 * 9 + 1] = uVar8;
    }
    local_320 = (ulong)((int)local_320 + 1);
    local_318.init = -1;
    local_318.final = -1;
LAB_002adff6:
    local_340.init = -1;
    local_340.final = -1;
    rVar15.init = -1;
    rVar15.final = 0;
    uVar24 = 0xffffffff;
    uVar22 = 0xffffffff;
    uVar21 = 0xffffffff;
    local_334 = -1;
    rVar17.init = -1;
    rVar17.final = 0;
    iVar10 = -1;
    iVar9 = -1;
    goto LAB_002ae8b2;
  case L')':
    if ((int)local_320 != 0) goto LAB_002ae42b;
    local_320 = 0;
    goto LAB_002ae8b2;
  case L'.':
    typ = RE_WILDCARD;
    goto LAB_002adda0;
  }
  switch(wVar5) {
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
  case L'8':
  case L'9':
    wVar5 = utf8_ptr::s_getch((char *)pCVar18);
    pCVar23 = local_360;
    build_group_matcher(local_360,&local_350,wVar5 + L'\xffffffcf');
    rVar15 = local_348;
    pbVar25 = local_358;
    goto LAB_002ae502;
  default:
switchD_002add69_caseD_3a:
    wVar5 = utf8_ptr::s_getch((char *)pCVar18);
    pCVar23 = local_360;
    goto LAB_002ade94;
  case L'<':
    build_special(local_360,&local_350,RE_WORD_BEGIN,L'\0');
    rVar15 = local_350;
    iVar10 = local_310;
    goto joined_r0x002ae2d3;
  case L'>':
    build_special(local_360,&local_350,RE_WORD_END,L'\0');
    iVar10 = (int)uVar22;
    rVar15 = local_350;
    goto joined_r0x002ae2d3;
  case L'B':
    build_special(local_360,&local_350,RE_NON_WORD_BOUNDARY,L'\0');
    iVar10 = rVar15.init;
    rVar15 = local_350;
joined_r0x002ae2d3:
    local_350 = rVar15;
    if (iVar10 != -1) {
      build_concat(pCVar23,&local_330,&local_340,&local_350);
      rVar15 = local_330;
    }
LAB_002adbf2:
    local_334 = rVar15.init;
    uVar24 = (ulong)rVar15 & 0xffffffff;
    uVar22 = (ulong)rVar15 & 0xffffffff;
    uVar21 = (ulong)rVar15 & 0xffffffff;
    rVar17 = (re_machine)((ulong)rVar15 & 0xffffffff);
    iVar10 = local_334;
    iVar9 = local_334;
    local_340 = rVar15;
LAB_002ae8b2:
    pbVar25 = pbVar25 + -1;
LAB_002ae8ba:
    bVar4 = (byte)((CRegexParser *)local_368.p_)->next_state_;
    local_368.p_ = (char *)((long)&((CRegexParser *)local_368.p_)->next_state_ +
                           (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
    goto LAB_002ad85e;
  case L'D':
    typ = RE_NON_DIGIT;
    break;
  case L'S':
    typ = RE_NON_SPACE;
    break;
  case L'V':
    typ = RE_NON_VSPACE;
    break;
  case L'W':
    typ = RE_NON_WORD_CHAR;
  }
LAB_002adda0:
  pCVar23 = local_360;
  build_special(local_360,&local_350,typ,L'\0');
  rVar15 = local_348;
  pbVar25 = local_358;
LAB_002ae502:
  do {
    uVar19.p_ = local_368.p_;
    uVar20.p_ = local_368.p_;
    pbVar11 = local_358;
    if ((byte *)0x1 < pbVar25) {
      local_348 = rVar15;
      wVar5 = utf8_ptr::s_getch_at(local_368.p_,1);
      if ((uint)(wVar5 + L'\xffffffd6') < 2) {
LAB_002ae539:
        uVar14 = 0;
        uVar20.p_ = uVar19.p_ +
                    (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 &
                           (uint)((byte)*uVar19.p_ >> 7) * 3) + 1;
        pbVar25 = pbVar25 + -1;
        local_368.p_ = uVar20.p_;
        local_358 = pbVar25;
        if ((byte *)0x1 < pbVar25) {
          wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1);
          uVar14 = (uint)(wVar5 == L'?');
        }
        wVar5 = utf8_ptr::s_getch(uVar20.p_);
        build_closure(pCVar23,&local_330,&local_350,wVar5,uVar14);
      }
      else {
        if (wVar5 != L'{') {
          rVar15 = local_348;
          uVar20.p_ = local_368.p_;
          pbVar11 = local_358;
          if (wVar5 != L'?') goto LAB_002ae86b;
          goto LAB_002ae539;
        }
        if (local_328->loop_var_cnt <= (int)local_320) {
          local_328->loop_var_cnt = (int)local_320 + 1;
        }
        uVar21 = (ulong)((((byte)*uVar19.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*uVar19.p_ >> 7) * 3)
        ;
        local_368.p_ = uVar19.p_ +
                       ((((byte)uVar19.p_[uVar21 + 1] >> 5 & 1) != 0) + 1 &
                       (uint)((byte)uVar19.p_[uVar21 + 1] >> 7) * 3) + uVar21 + 2;
        local_358 = pbVar25 + -2;
        iVar9 = parse_int((CRegexParser *)uVar20.p_,&local_368,(size_t *)&local_358);
        pbVar11 = local_358;
        uVar19.p_ = local_368.p_;
        uVar20.p_ = local_368.p_;
        iVar10 = iVar9;
        if (local_358 != (byte *)0x0) {
          this_00.p_ = local_368.p_;
          wVar5 = utf8_ptr::s_getch(local_368.p_);
          uVar20.p_ = local_368.p_;
          if (wVar5 == L',') {
            bVar4 = *uVar19.p_;
            local_368.p_ = uVar19.p_ +
                           (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1;
            local_358 = pbVar11 + -1;
            iVar10 = parse_int((CRegexParser *)this_00.p_,&local_368,(size_t *)&local_358);
            uVar20.p_ = local_368.p_;
            pbVar11 = local_358;
            if (local_358 == (byte *)0x0) goto LAB_002ae6d5;
          }
          do {
            wVar5 = utf8_ptr::s_getch(uVar20.p_);
            if (wVar5 == L'}') {
              uVar14 = 0;
              pbVar25 = (byte *)0x1;
              local_368.p_ = uVar20.p_;
              local_358 = pbVar11;
              if (pbVar11 != (byte *)0x1) {
                wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1);
                if (wVar5 == L'?') {
                  bVar4 = (byte)((CRegexParser *)uVar20.p_)->next_state_;
                  uVar20.p_ = (char *)((long)&((CRegexParser *)uVar20.p_)->next_state_ +
                                      (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3)
                                      + 1);
                  pbVar11 = pbVar11 + -1;
                  local_368.p_ = uVar20.p_;
                  local_358 = pbVar11;
                }
                uVar14 = (uint)(wVar5 == L'?');
                pbVar25 = pbVar11;
              }
              goto LAB_002ae6ec;
            }
            bVar4 = (byte)((CRegexParser *)uVar20.p_)->next_state_;
            pCVar23 = (CRegexParser *)
                      ((long)&((CRegexParser *)uVar20.p_)->next_state_ +
                      (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
            pbVar11 = (byte *)((long)uVar20.p_ + ((long)pbVar11 - (long)pCVar23));
            uVar20.p_ = (char *)pCVar23;
          } while (pbVar11 != (byte *)0x0);
        }
LAB_002ae6d5:
        local_358 = (byte *)0x0;
        uVar14 = 0;
        pbVar25 = (byte *)0x0;
        local_368.p_ = uVar20.p_;
LAB_002ae6ec:
        pCVar23 = local_360;
        build_interval(local_360,&local_330,&local_350,iVar9,iVar10,(int)local_320,uVar14);
      }
      local_350 = local_330;
      rVar15 = local_348;
      pbVar11 = pbVar25;
      if ((byte *)0x1 < pbVar25) {
        do {
          while (((wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1), wVar5 != L'?' &&
                  (wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1), wVar5 != L'+')) &&
                 (wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1), wVar5 != L'*'))) {
            wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1);
            rVar15 = local_348;
            pbVar11 = pbVar25;
            if (wVar5 != L'{') goto LAB_002ae86b;
            while (wVar5 = utf8_ptr::s_getch_at(uVar20.p_,1), wVar5 != L'}') {
              bVar4 = (byte)((CRegexParser *)uVar20.p_)->next_state_;
              uVar20.p_ = (char *)((long)&((CRegexParser *)uVar20.p_)->next_state_ +
                                  (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1)
              ;
              pbVar25 = pbVar25 + -1;
              if (pbVar25 < (byte *)0x2) goto LAB_002ae7dc;
            }
          }
          bVar4 = (byte)((CRegexParser *)uVar20.p_)->next_state_;
          uVar20.p_ = (char *)((long)&((CRegexParser *)uVar20.p_)->next_state_ +
                              (ulong)(((bVar4 >> 5 & 1) != 0) + 1 & (uint)(bVar4 >> 7) * 3) + 1);
          pbVar25 = pbVar25 + -1;
        } while ((byte *)0x1 < pbVar25);
LAB_002ae7dc:
        pbVar25 = (byte *)0x1;
        rVar15 = local_348;
        pbVar11 = pbVar25;
      }
    }
LAB_002ae86b:
    local_358 = pbVar11;
    local_368.p_ = uVar20.p_;
    rVar17 = local_350;
    if (rVar15.init != -1) {
      build_concat(pCVar23,&local_330,&local_340,&local_350);
      rVar17 = local_330;
    }
    local_334 = rVar17.init;
    uVar21 = (ulong)rVar17 & 0xffffffff;
    uVar22 = (ulong)rVar17 & 0xffffffff;
    uVar24 = (ulong)rVar17 & 0xffffffff;
    rVar15 = (re_machine)((ulong)rVar17 & 0xffffffff);
    iVar10 = local_334;
    iVar9 = local_334;
    uVar19.p_ = local_368.p_;
    pbVar11 = local_358;
    local_340 = rVar17;
LAB_002ae8a9:
    local_358 = pbVar11;
    local_368.p_ = uVar19.p_;
    if (pbVar25 != (byte *)0x0) goto LAB_002ae8b2;
LAB_002ae413:
    pCVar23 = local_360;
    if ((int)local_320 == 0) {
      alternate_onto(local_360,&local_318,&local_340);
      rVar3 = local_318.init;
      iVar10 = break_loops(pCVar23,local_318.init,local_318.final,(regex_scan_frame *)0x0);
      if (iVar10 != 0) {
        local_318.final = rVar3;
      }
      machine = &local_318;
      remove_branch_to_branch(pCVar23,machine);
      consolidate_strings(pCVar23,machine);
      local_328->machine = local_318;
      local_328->tuple_cnt = pCVar23->next_state_;
      if (10 < local_328->group_cnt) {
        local_328->group_cnt = 10;
      }
      if (local_328->loop_var_cnt < 0x15) {
        return RE_STATUS_SUCCESS;
      }
      local_328->loop_var_cnt = 0x14;
      return RE_STATUS_SUCCESS;
    }
LAB_002ae42b:
    pCVar23 = local_360;
    uVar21 = (ulong)((int)local_320 - 1U);
    lVar13 = (long)(int)((int)local_320 - 1U);
    lVar1 = lVar13 * 0x24;
    uVar14 = auStack_2ec[lVar13 * 9 + 1];
    rVar15 = local_340;
    if (uVar14 != 0) {
      build_special(local_360,&local_350,RE_LOOKBACK_POS,L'\0');
      rVar15 = local_350;
      if (local_334 != -1) {
        build_concat(pCVar23,&local_330,&local_340,&local_350);
        rVar15 = local_330;
      }
    }
    local_340 = rVar15;
    alternate_onto(pCVar23,&local_318,&local_340);
    local_320 = uVar21;
    if (*(int *)((long)&uStack_2f4 + lVar1) == 0) {
      if (auStack_2ec[lVar13 * 9] == 0 && auStack_2ec[lVar13 * 9 + -1] == 0) {
        local_350 = local_318;
      }
      else {
        build_assert(pCVar23,&local_350,&local_318,auStack_2ec[lVar13 * 9 + -1],uVar14);
      }
    }
    else {
      build_group(pCVar23,&local_350,&local_318,(&iStack_2f8)[lVar13 * 9]);
    }
    local_340 = *(re_machine *)((long)arStack_308 + lVar1);
    local_318 = *(re_machine *)((long)arStack_308 + lVar1 + 8);
    rVar15 = local_340;
    pbVar25 = local_358;
  } while( true );
}

Assistant:

re_status_t CRegexParser::compile(const char *expr_str, size_t exprlen,
                                  re_compiled_pattern_base *pat)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    int group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
        int capturing;
        int neg_assertion;
        int pos_assertion;
        int back_assertion;
    } group_stack[RE_GROUP_NESTING_MAX];
    utf8_ptr expr;

    /* reset everything */
    reset();

    /* we have no groups yet */
    pat->group_cnt = 0;

    /* we have no looping variables yet */
    pat->loop_var_cnt = 0;

    /* get the length of the expression in characters */
    size_t exprchars = utf8_ptr::s_len(expr_str, exprlen);

    /* 
     *   set the default match modes - maximum, first-beginning,
     *   case-sensitive 
     */
    pat->longest_match = TRUE;
    pat->first_begin = TRUE;
    pat->case_sensitive = TRUE;
    pat->case_sensitivity_specified = FALSE;

    /* start out with no current machine and no alternate machine */
    build_null_machine(&cur_machine);
    build_null_machine(&alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for (expr.set((char *)expr_str) ; exprchars != 0 ; expr.inc(), --exprchars)
    {
        switch(expr.getch())
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!is_machine_null(&cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            build_special(&new_machine, RE_TEXT_BEGIN, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, treat it as a normal character 
             */
            if (exprchars > 1
                && (expr.getch_at(1) != ')' && expr.getch_at(1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            build_special(&new_machine, RE_TEXT_END, 0);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            concat_onto(&cur_machine, &new_machine);
            break;
            
        case '(':
            {
                int capturing;
                int pos_assertion;
                int neg_assertion;
                int back_assertion;

                /* presume it's a capturing group */
                capturing = TRUE;

                /* presume it's not an assertion */
                pos_assertion = FALSE;
                neg_assertion = FALSE;
                back_assertion = FALSE;
                
                /* 
                 *   Add a nesting level.  Push the current machine and
                 *   alternate machines onto the group stack, and clear
                 *   everything out for the new group.  
                 */
                if (group_stack_level > RE_GROUP_NESTING_MAX)
                {
                    /* we cannot proceed - return an error */
                    return RE_STATUS_GROUP_NESTING_TOO_DEEP;
                }
                
                /* save the current state on the stack */
                group_stack[group_stack_level].old_cur = cur_machine;
                group_stack[group_stack_level].old_alter = alter_machine;
                
                /* 
                 *   Assign the group a group ID - groups are numbered in
                 *   order of their opening (left) parentheses, so we want
                 *   to assign a group number now.  We won't actually need
                 *   to know the group number until we get to the matching
                 *   close paren, but we need to assign it now, so store
                 *   it in the group stack.  
                 */
                group_stack[group_stack_level].group_id = pat->group_cnt;
                
                /* check for special group flags */
                if (exprchars > 2 && expr.getch_at(1) == '?')
                {
                    switch(expr.getch_at(2))
                    {
                    case '<':
                        /* look-back assertion */
                        if (exprchars > 3
                            && (expr.getch_at(3) == '='
                                || expr.getch_at(3) == '!'))
                        {
                            /* it's a look-back assertion */
                            back_assertion = TRUE;

                            /* assertions don't capture */
                            capturing = FALSE;

                            /* note whether it's positive or negative */
                            if (expr.getch_at(3) == '=')
                                pos_assertion = TRUE;
                            else
                                neg_assertion = TRUE;

                            /* skip the '?<=' or '?<!' part */
                            expr.inc();
                            expr.inc();
                            expr.inc();
                            exprchars -= 3;
                        }
                        break;
                        
                    case ':':
                        /* it's a non-capturing group */
                        capturing = FALSE;

                        /* skip two extra characters for the '?:' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '=':
                        /* it's a positive assertion group */
                        pos_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?=' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    case '!':
                        /* it's a negative assertion group */
                        neg_assertion = TRUE;

                        /* assertions don't capture */
                        capturing = FALSE;

                        /* skip two extra characters for the '?!' part */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        break;
                        
                    default:
                        /* it's not a recognized sequence - ignore it */
                        break;
                    }
                }

                /* remember if the group is capturing */
                group_stack[group_stack_level].capturing = capturing;

                /* remember if it's an assertion of some kind */
                group_stack[group_stack_level].pos_assertion = pos_assertion;
                group_stack[group_stack_level].neg_assertion = neg_assertion;
                group_stack[group_stack_level].back_assertion = back_assertion;
                
                /* consume the group number if it's a capturing group */
                if (capturing)
                    ++(pat->group_cnt);
                
                /* push the level */
                ++group_stack_level;
                
                /* start the new group with empty machines */
                build_null_machine(&cur_machine);
                build_null_machine(&alter_machine);
            }
            break;

        case ')':
        do_close_paren:
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   For a lookback assertion, add the lookback parent position
             *   match assertion to the group.  This ensures that we can only
             *   match the group when the match leaves us at the same
             *   position where the lookback assertion was matched.  
             */
            if (group_stack[group_stack_level].back_assertion)
            {
                build_special(&new_machine, RE_LOOKBACK_POS, 0);
                concat_onto(&cur_machine, &new_machine);
            }

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            alternate_onto(&alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.
             *   
             *   If this is a non-capturing group, don't bother building
             *   the new machine - just copy the current alternation
             *   machine onto the new machine.  
             */
            if (group_stack[group_stack_level].capturing)
            {
                /* it's a regular capturing group - add the group machine */
                build_group(&new_machine, &alter_machine,
                            group_stack[group_stack_level].group_id);
            }
            else if (group_stack[group_stack_level].pos_assertion
                     || group_stack[group_stack_level].neg_assertion)
            {
                /* it's an assertion - build the assertion group */
                build_assert(&new_machine, &alter_machine,
                             group_stack[group_stack_level].neg_assertion,
                             group_stack[group_stack_level].back_assertion);
            }
            else
            {
                /* it's a non-capturing group - just add the group tree */
                new_machine = alter_machine;
            }

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            alternate_onto(&alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            build_null_machine(&cur_machine);
            break;

        case '<':
            /* check for our various special directives */
            if ((exprchars >= 4 && memicmp(expr.getptr(), "<FE>", 4) == 0)
                || (exprchars >= 10
                    && memicmp(expr.getptr(), "<FirstEnd>", 10) == 0))
            {
                /* turn off first-begin mode */
                pat->first_begin = FALSE;
            }
            else if ((exprchars >= 4 && memicmp(expr.getptr(), "<FB>", 4) == 0)
                     || (exprchars >= 12
                         && memicmp(expr.getptr(), "<FirstBegin>", 12) == 0))
            {
                /* turn on first-begin mode */
                pat->first_begin = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Max>", 5) == 0)
            {
                /* turn on longest-match mode */
                pat->longest_match = TRUE;
            }
            else if (exprchars >= 5 && memicmp(expr.getptr(), "<Min>", 5) == 0)
            {
                /* turn off longest-match mode */
                pat->longest_match = FALSE;
            }
            else if (exprchars >= 6
                     && memicmp(expr.getptr(), "<Case>", 6) == 0)
            {
                /* turn on case sensitivity */
                pat->case_sensitive = TRUE;
                pat->case_sensitivity_specified = TRUE;
            }
            else if (exprchars >= 8
                     && memicmp(expr.getptr(), "<NoCase>", 8) == 0)
            {
                /* turn off case sensitivity */
                pat->case_sensitive = FALSE;
                pat->case_sensitivity_specified = TRUE;
            }
            else
            {
                /*
                 *   It's nothing else we recognize, so it must be a
                 *   character class or class range expression, which
                 *   consists of one or more classes, single characters, or
                 *   character ranges separated by '|' delimiters.  
                 */
                if (compile_char_class_expr(&expr, &exprchars, &new_machine))
                {
                    /* success - look for postfix operators */
                    goto apply_postfix;
                }
                else
                {
                    /* 
                     *   failure - treat the whole thing as ordinary
                     *   characters 
                     */
                    goto normal_char;
                }
            }

            /* skip everything up to the closing ">" */
            while (exprchars > 0 && expr.getch() != '>')
                expr.inc(), --exprchars ;
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            expr.inc();
            --exprchars;

            /* check to see if we're at the end of the expression */
            if (exprchars == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                expr.dec();
                ++exprchars;
                break;
            }

            /* see what we have */
            switch(expr.getch())
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                build_group_matcher(&new_machine,
                                    value_of_digit(expr.getch()) - 1);

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                build_special(&new_machine, RE_WORD_BEGIN, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                build_special(&new_machine, RE_WORD_END, 0);

                /* it can't be postfixed - just concatenate it */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                build_special(&new_machine, RE_WORD_CHAR, 0);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                build_special(&new_machine, RE_NON_WORD_CHAR, 0);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                build_special(&new_machine, RE_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                build_special(&new_machine, RE_NON_WORD_BOUNDARY, 0);

                /* it can't be postfixed */
                concat_onto(&cur_machine, &new_machine);
                break;

            case 's':
                /* %s -> same as <space> */
                build_special(&new_machine, RE_SPACE, 0);
                goto apply_postfix;

            case 'S':
                /* %S -> same as <^space> */
                build_special(&new_machine, RE_NON_SPACE, 0);
                goto apply_postfix;

            case 'd':
                /* %d -> same as <digit> */
                build_special(&new_machine, RE_DIGIT, 0);
                goto apply_postfix;

            case 'D':
                /* %D -> same as <^digit> */
                build_special(&new_machine, RE_NON_DIGIT, 0);
                goto apply_postfix;

            case 'v':
                /* %v -> same as <vspace> */
                build_special(&new_machine, RE_VSPACE, 0);
                goto apply_postfix;

            case 'V':
                /* %V -> same as <^vspace> */
                build_special(&new_machine, RE_NON_VSPACE, 0);
                goto apply_postfix;

            default:
                /* build a new literal character recognizer */
                build_char(&new_machine, expr.getch());

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            build_special(&new_machine, RE_WILDCARD, 0);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;

                /* we have no entries yet */
                range_buf_cnt_ = 0;

                /* first, skip the open bracket */
                expr.inc();
                --exprchars;

                /* check to see if starts with the exclusion character */
                if (exprchars != 0 && expr.getch() == '^')
                {
                    /* skip the exclusion specifier */
                    expr.inc();
                    --exprchars;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == ']')
                {
                    add_range_char(']');
                    expr.inc();
                    --exprchars;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprchars != 0 && expr.getch() == '-')
                {
                    add_range_char('-');
                    expr.inc();
                    --exprchars;
                }

                /* scan the character set */
                while (exprchars != 0 && expr.getch() != ']')
                {
                    /* note this character */
                    wchar_t ch = expr.getch();

                    /* skip this character of the expression */
                    expr.inc();
                    --exprchars;

                    /* check for a range */
                    if (exprchars != 0 && expr.getch() == '-')
                    {
                        /* skip the '-' */
                        expr.inc();
                        --exprchars;
                        if (exprchars != 0)
                        {
                            /* get the other end of the range */
                            wchar_t ch2 = expr.getch();

                            /* skip the second character */
                            expr.inc();
                            --exprchars;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                wchar_t tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* add the range */
                            add_range_char(ch, ch2);
                        }
                    }
                    else
                    {
                        /* no range - add the one-character range */
                        add_range_char(ch);
                    }
                }

                /* create a character range machine */
                build_char_range(&new_machine, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            build_char(&new_machine, expr.getch());

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprchars > 1)
            {
                switch(expr.getch_at(1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        /* move onto the closure operator */
                        expr.inc();
                        --exprchars;

                        /* 
                         *   if the next character is '?', it's a modifier
                         *   that indicates that we are to use the
                         *   shortest match - note it if so 
                         */
                        int shortest =
                            (exprchars > 1 && expr.getch_at(1) == '?');

                        /* build the closure machine */
                        re_machine closure_machine;
                        build_closure(&closure_machine,
                                      &new_machine, expr.getch(), shortest);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                    }
                        
                    /* 
                     *   skip any redundant closure symbols, keeping only the
                     *   first one we saw 
                     */
                skip_closures:
                    while (exprchars > 1)
                    {
                        /* check for a simple closure suffix */
                        if (expr.getch_at(1) == '?'
                            || expr.getch_at(1) == '+'
                            || expr.getch_at(1) == '*')
                        {
                            /* skip it and keep looping */
                            expr.inc();
                            --exprchars;
                            continue;
                        }
                        
                        /* check for an interval */
                        if (expr.getch_at(1) == '{')
                        {
                            /* skip until we find the matching '}' */
                            while (exprchars > 1 && expr.getch_at(1) != '}')
                                expr.inc(), --exprchars;
                            
                            /* go back for anything that follows */
                            continue;
                        }
                        
                        /* if it's anything else, we're done discarding */
                        break;
                    }
                    break;

                case '{':
                    /* interval specifier */
                    {
                        int min_val;
                        int max_val;
                        re_machine interval_machine;
                        int shortest;
                        int var_id;

                        /* 
                         *   loops can never overlap, but can be nested;
                         *   so the only thing we have to worry about in
                         *   assigning a loop variable is the group
                         *   nesting depth 
                         */
                        var_id = group_stack_level;

                        /* note the highest variable ID we've seen */
                        if (var_id >= pat->loop_var_cnt)
                            pat->loop_var_cnt = var_id + 1;

                        /* presume neither min nor max will be specified */
                        min_val = -1;
                        max_val = -1;
                        
                        /* skip the current character and the '{' */
                        expr.inc();
                        expr.inc();
                        exprchars -= 2;
                        
                        /* parse the minimum count, if provided */
                        min_val = parse_int(&expr, &exprchars);

                        /* if there's a comma, parse the maximum value */
                        if (exprchars >= 1 && expr.getch() == ',')
                        {
                            /* skip the ',' and parse the number */
                            expr.inc();
                            --exprchars;
                            max_val = parse_int(&expr, &exprchars);
                        }
                        else
                        {
                            /* 
                             *   there's no other value, so this is a
                             *   simple loop with the same value for min
                             *   and max 
                             */
                            max_val = min_val;
                        }

                        /* 
                         *   if we're not looking at a '}', skip
                         *   characters until we are 
                         */
                        while (exprchars != 0 && expr.getch() != '}')
                            expr.inc(&exprchars);

                        /* 
                         *   if there's a '?' following, it's a 'shortest'
                         *   modifier - note it 
                         */
                        shortest = FALSE;
                        if (exprchars > 1 && expr.getch_at(1) == '?')
                        {
                            /* note the modifier */
                            shortest = TRUE;

                            /* skip another character for the modifier */
                            expr.inc();
                            --exprchars;
                        }

                        /* set up an interval node */
                        build_interval(&interval_machine, &new_machine,
                                       min_val, max_val, var_id, shortest);

                        /* replace the original machine with the interval */
                        new_machine = interval_machine;

                        /* skip any closure modifiers that follow */
                        goto skip_closures;
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            concat_onto(&cur_machine, &new_machine);
            break;
        }

        /* if we've run down the expression string, go no further */
        if (exprchars == 0)
            break;
    }

    /* if there are any open parens outstanding, close them */
    if (group_stack_level != 0)
        goto do_close_paren;

    /* complete any pending alternation */
    alternate_onto(&alter_machine, &cur_machine);

    /* check for and break any infinite loops */
    break_loops(&alter_machine);

    /* remove meaningless branch-to-branch transitions */
    remove_branch_to_branch(&alter_machine);

    /* consolidate consecutive character transitions into strings */
    consolidate_strings(&alter_machine);

    /* store the results in the caller's base pattern description */
    pat->machine = alter_machine;
    pat->tuple_cnt = next_state_;

    /* limit the group count to the maximum */
    if (pat->group_cnt > RE_GROUP_REG_CNT)
        pat->group_cnt = RE_GROUP_REG_CNT;

    /* limit the variable count to the maximum */
    if (pat->loop_var_cnt > RE_LOOP_VARS_MAX)
        pat->loop_var_cnt = RE_LOOP_VARS_MAX;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}